

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

string * wabt::StringPrintf_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined4 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  allocator local_8d [20];
  allocator_type local_79;
  undefined1 local_78 [8];
  vector<char,_std::allocator<char>_> buffer;
  size_t len;
  va_list args_copy;
  undefined4 uStack_38;
  undefined4 uStack_34;
  va_list args;
  char *format_local;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Da;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  args_copy[0].overflow_arg_area = local_148;
  args_copy[0]._0_8_ = &stack0x00000008;
  uStack_34 = 0x30;
  uStack_38 = 0x10;
  len = 0x3000000010;
  local_138 = in_RDX;
  local_130 = in_RCX;
  local_128 = in_R8;
  local_120 = in_R9;
  args[0]._0_8_ = args_copy[0]._0_8_;
  args[0].overflow_arg_area = args_copy[0].overflow_arg_area;
  iVar1 = vsnprintf((char *)0x0,0,format,&uStack_38);
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = (long)(iVar1 + 1);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_78,(long)(iVar1 + 1),&local_79);
  std::allocator<char>::~allocator(&local_79);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_78);
  vsnprintf(pcVar2,buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,format,&len
           );
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_78);
  uVar3 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ - 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,uVar3,local_8d);
  std::allocator<char>::~allocator((allocator<char> *)local_8d);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_78)
  ;
  return __return_storage_ptr__;
}

Assistant:

StringPrintf(const char* format, ...) {
  va_list args;
  va_list args_copy;
  va_start(args, format);
  va_copy(args_copy, args);
  size_t len = wabt_vsnprintf(nullptr, 0, format, args) + 1;  // For \0.
  std::vector<char> buffer(len);
  va_end(args);
  wabt_vsnprintf(buffer.data(), len, format, args_copy);
  va_end(args_copy);
  return std::string(buffer.data(), len - 1);
}